

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yl_schema_features.c
# Opt level: O2

void get_features(ly_set *fset,char *module,char ***features)

{
  uint uVar1;
  lyd_node *plVar2;
  int iVar3;
  uint32_t u;
  ulong uVar4;
  
  uVar1 = fset->count;
  uVar4 = 0;
  do {
    if (uVar1 == uVar4) {
      *features = (char **)0x0;
      return;
    }
    plVar2 = (fset->field_2).dnodes[uVar4];
    iVar3 = strcmp(module,*(char **)plVar2);
    uVar4 = uVar4 + 1;
  } while (iVar3 != 0);
  *features = (char **)plVar2->schema;
  *(undefined1 *)&plVar2->parent = 1;
  return;
}

Assistant:

void
get_features(const struct ly_set *fset, const char *module, const char ***features)
{
    /* get features list for this module */
    for (uint32_t u = 0; u < fset->count; ++u) {
        struct yl_schema_features *sf = (struct yl_schema_features *)fset->objs[u];

        if (!strcmp(module, sf->mod_name)) {
            /* matched module - explicitly set features */
            *features = (const char **)sf->features;
            sf->applied = 1;
            return;
        }
    }

    /* features not set so disable all */
    *features = NULL;
}